

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_filter_count.c
# Opt level: O0

void read_test(char *name)

{
  int iVar1;
  wchar_t wVar2;
  archive_conflict *a_00;
  int r;
  archive *a;
  char *name_local;
  
  a_00 = (archive_conflict *)archive_read_new();
  iVar1 = archive_read_support_filter_bzip2((archive *)a_00);
  if (((iVar1 != -0x14) || (wVar2 = canBzip2(), wVar2 != L'\0')) && (-0x15 < iVar1)) {
    iVar1 = archive_read_support_format_all((archive *)a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_filter_count.c"
                        ,L'*',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a_00);
    extract_reference_file(name);
    wVar2 = archive_read_open_filename(a_00,name,2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_filter_count.c"
                        ,L'-',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, name, 2)",
                        a_00);
    iVar1 = archive_filter_count((archive *)a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_filter_count.c"
                        ,L'/',2,"2",(long)iVar1,"archive_filter_count(a)",(void *)0x0);
    archive_read_free((archive *)a_00);
    return;
  }
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_filter_count.c"
                 ,L'&');
  test_skipping("bzip2 unsupported");
  return;
}

Assistant:

static void
read_test(const char *name)
{
	struct archive* a = archive_read_new();
	int r;

	r = archive_read_support_filter_bzip2(a);
	if((ARCHIVE_WARN == r && !canBzip2()) || ARCHIVE_WARN > r) {
		skipping("bzip2 unsupported");
		return;
	}

	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));

	extract_reference_file(name);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, name, 2));
	/* bzip2 and none */
	assertEqualInt(2, archive_filter_count(a));
	
	archive_read_free(a);
}